

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLABecLaplacian::FFlux
          (MLABecLaplacian *this,int amrlev,MFIter *mfi,Array<FArrayBox_*,_3> *flux,FArrayBox *sol,
          Location param_5,int face_only)

{
  long lVar1;
  long lVar2;
  Vector<int,_std::allocator<int>_> *pVVar3;
  int ncomp;
  int *piVar4;
  int *piVar5;
  Array<const_FArrayBox_*,_3> local_68;
  Box local_4c;
  
  MFIter::tilebox(&local_4c,mfi);
  lVar1 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  lVar2 = *(long *)&(this->m_b_coeffs).
                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  pVVar3 = mfi->local_index_map;
  piVar5 = &mfi->currentIndex;
  piVar4 = piVar5;
  if (pVVar3 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = (pVVar3->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + *piVar5;
  }
  local_68._M_elems[0] = *(FArrayBox **)(*(long *)(lVar2 + 0x108) + (long)*piVar4 * 8);
  piVar4 = piVar5;
  if (pVVar3 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = (pVVar3->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + *piVar5;
  }
  local_68._M_elems[1] = *(FArrayBox **)(*(long *)(lVar2 + 0x288) + (long)*piVar4 * 8);
  if (pVVar3 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar5 = (pVVar3->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + *piVar5;
  }
  local_68._M_elems[2] = *(FArrayBox **)(*(long *)(lVar2 + 0x408) + (long)*piVar5 * 8);
  FFlux(&local_4c,(Real *)(lVar1 + 0x38),this->m_b_scalar,&local_68,flux,sol,face_only,ncomp);
  return;
}

Assistant:

void
MLABecLaplacian::FFlux (int amrlev, const MFIter& mfi,
                        const Array<FArrayBox*,AMREX_SPACEDIM>& flux,
                        const FArrayBox& sol, Location, const int face_only) const
{
    BL_PROFILE("MLABecLaplacian::FFlux()");

    const int mglev = 0;
    const Box& box = mfi.tilebox();
    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    const int ncomp = getNComp();
    FFlux(box, dxinv, m_b_scalar,
          Array<FArrayBox const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&(m_b_coeffs[amrlev][mglev][0][mfi]),
                                                               &(m_b_coeffs[amrlev][mglev][1][mfi]),
                                                               &(m_b_coeffs[amrlev][mglev][2][mfi]))}},
          flux, sol, face_only, ncomp);
}